

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O3

int mriStep_SetNonlinearSolver(ARKodeMem ark_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  int iVar2;
  code *pcVar3;
  char *msgfmt;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_20;
  
  iVar2 = mriStep_AccessStepMem(ark_mem,"mriStep_SetNonlinearSolver",&local_20);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (NLS == (SUNNonlinearSolver)0x0) {
    msgfmt = "The NLS input must be non-NULL";
    ark_mem = (ARKodeMem)0x0;
    iVar2 = 0x30;
  }
  else {
    p_Var1 = NLS->ops;
    if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
        (p_Var1->solve ==
         (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0))
       || (p_Var1->setsysfn == (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
      msgfmt = "NLS does not support required operations";
      iVar2 = 0x39;
    }
    else {
      if ((local_20->NLS != (SUNNonlinearSolver)0x0) && (local_20->ownNLS != 0)) {
        SUNNonlinSolFree();
      }
      local_20->NLS = NLS;
      local_20->ownNLS = 0;
      iVar2 = SUNNonlinSolGetType(NLS);
      if (iVar2 == 0) {
        pcVar3 = mriStep_NlsResidual;
      }
      else {
        iVar2 = SUNNonlinSolGetType(NLS);
        if (iVar2 != 1) {
          msgfmt = "Invalid nonlinear solver type";
          iVar2 = 0x53;
          goto LAB_00152644;
        }
        pcVar3 = mriStep_NlsFPFunction;
      }
      iVar2 = SUNNonlinSolSetSysFn(local_20->NLS,pcVar3);
      if (iVar2 == 0) {
        iVar2 = SUNNonlinSolSetConvTestFn(local_20->NLS,mriStep_NlsConvTest,ark_mem);
        if (iVar2 == 0) {
          iVar2 = SUNNonlinSolSetMaxIters(local_20->NLS,local_20->maxcor);
          if (iVar2 == 0) {
            local_20->nls_fsi = (ARKRhsFn)0x0;
            if (local_20->implicit_rhs == 0) {
              return 0;
            }
            if (local_20->fsi != (ARKRhsFn)0x0) {
              local_20->nls_fsi = local_20->fsi;
              return 0;
            }
            msgfmt = "The implicit slow ODE RHS function is NULL";
            iVar2 = 0x78;
          }
          else {
            msgfmt = "Setting maximum number of nonlinear iterations failed";
            iVar2 = 0x6c;
          }
        }
        else {
          msgfmt = "Setting convergence test function failed";
          iVar2 = 99;
        }
      }
      else {
        msgfmt = "Setting nonlinear system function failed";
        iVar2 = 0x59;
      }
    }
  }
LAB_00152644:
  arkProcessError(ark_mem,-0x16,iVar2,"mriStep_SetNonlinearSolver",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                  ,msgfmt);
  return -0x16;
}

Assistant:

int mriStep_SetNonlinearSolver(ARKodeMem ark_mem, SUNNonlinearSolver NLS)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if NLS input is NULL */
  if (NLS == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The NLS input must be non-NULL");
    return (ARK_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if ((NLS->ops->gettype == NULL) || (NLS->ops->solve == NULL) ||
      (NLS->ops->setsysfn == NULL))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (ARK_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
  {
    retval = SUNNonlinSolFree(step_mem->NLS);
  }

  /* set SUNNonlinearSolver pointer */
  step_mem->NLS    = NLS;
  step_mem->ownNLS = SUNFALSE;

  /* set the nonlinear residual/fixed-point function, based on solver type */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND)
  {
    retval = SUNNonlinSolSetSysFn(step_mem->NLS, mriStep_NlsResidual);
  }
  else if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_FIXEDPOINT)
  {
    retval = SUNNonlinSolSetSysFn(step_mem->NLS, mriStep_NlsFPFunction);
  }
  else
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid nonlinear solver type");
    return (ARK_ILL_INPUT);
  }
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (ARK_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(step_mem->NLS, mriStep_NlsConvTest,
                                     (void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (ARK_ILL_INPUT);
  }

  /* set default nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (ARK_ILL_INPUT);
  }

  /* set the nonlinear system RHS function */
  step_mem->nls_fsi = NULL;

  if (step_mem->implicit_rhs)
  {
    if (!(step_mem->fsi))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "The implicit slow ODE RHS function is NULL");
      return (ARK_ILL_INPUT);
    }
    step_mem->nls_fsi = step_mem->fsi;
  }

  return (ARK_SUCCESS);
}